

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O0

bool __thiscall t_js_generator::has_js_namespace(t_js_generator *this,t_program *p)

{
  long lVar1;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  string ns;
  t_program *p_local;
  t_js_generator *this_local;
  
  if ((this->no_ns_ & 1U) == 0) {
    ns.field_2._8_8_ = p;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,"js",&local_61);
    t_program::get_namespace((string *)local_40,p,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    lVar1 = std::__cxx11::string::size();
    this_local._7_1_ = lVar1 != 0;
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool has_js_namespace(t_program* p) {
    if (no_ns_) {
      return false;
    }
    std::string ns = p->get_namespace("js");
    return (ns.size() > 0);
  }